

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CreateForeignKey(Parse *pParse,ExprList *pFromCol,Token *pTo,ExprList *pToCol,int flags)

{
  sqlite3 *psVar1;
  int iVar2;
  FKey *pH;
  FKey *pFVar3;
  int *in_RCX;
  undefined8 *in_RDX;
  int *in_RSI;
  Parse *in_RDI;
  undefined4 in_R8D;
  int n;
  int j;
  int iCol;
  char *z;
  int nCol;
  int i;
  int nByte;
  Table *p;
  FKey *pNextTo;
  FKey *pFKey;
  sqlite3 *db;
  void *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  sqlite3 *in_stack_ffffffffffffffa0;
  sColMap *z_00;
  int local_54;
  int local_50;
  Table *data;
  char *in_stack_ffffffffffffffc0;
  
  psVar1 = in_RDI->db;
  data = in_RDI->pNewTable;
  if ((data == (Table *)0x0) || (in_RDI->declareVtab != '\0')) goto LAB_00167929;
  if (in_RSI == (int *)0x0) {
    in_stack_ffffffffffffff9c = data->nCol + -1;
    if (in_stack_ffffffffffffff9c < 0) goto LAB_00167929;
    if ((in_RCX != (int *)0x0) && (*in_RCX != 1)) {
      sqlite3ErrorMsg(in_RDI,"foreign key on %s should reference only one column of table %T",
                      data->aCol[in_stack_ffffffffffffff9c].zName,in_RDX);
      goto LAB_00167929;
    }
    local_54 = 1;
  }
  else {
    if ((in_RCX != (int *)0x0) && (*in_RCX != *in_RSI)) {
      sqlite3ErrorMsg(in_RDI,
                      "number of columns in foreign key does not match the number of columns in the referenced table"
                     );
      goto LAB_00167929;
    }
    local_54 = *in_RSI;
  }
  if (in_RCX != (int *)0x0) {
    for (local_50 = 0; local_50 < *in_RCX; local_50 = local_50 + 1) {
      sqlite3Strlen30(*(char **)(*(long *)(in_RCX + 2) + (long)local_50 * 0x20 + 8));
    }
  }
  pH = (FKey *)sqlite3DbMallocZero((sqlite3 *)
                                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                   (u64)in_stack_ffffffffffffff88);
  if (pH != (FKey *)0x0) {
    pH->pFrom = data;
    pH->pNextFrom = data->pFKey;
    z_00 = pH->aCol + local_54;
    pH->zTo = (char *)z_00;
    memcpy(z_00,(void *)*in_RDX,(ulong)*(uint *)(in_RDX + 1));
    *(undefined1 *)((long)&z_00->iFrom + (ulong)*(uint *)(in_RDX + 1)) = 0;
    sqlite3Dequote((char *)z_00);
    in_stack_ffffffffffffffa0 = (sqlite3 *)((long)&z_00->iFrom + (ulong)(*(int *)(in_RDX + 1) + 1));
    pH->nCol = local_54;
    if (in_RSI == (int *)0x0) {
      pH->aCol[0].iFrom = data->nCol + -1;
    }
    else {
      for (local_50 = 0; local_50 < local_54; local_50 = local_50 + 1) {
        for (in_stack_ffffffffffffff98 = 0; in_stack_ffffffffffffff98 < data->nCol;
            in_stack_ffffffffffffff98 = in_stack_ffffffffffffff98 + 1) {
          iVar2 = sqlite3_stricmp(data->aCol[in_stack_ffffffffffffff98].zName,
                                  *(char **)(*(long *)(in_RSI + 2) + (long)local_50 * 0x20 + 8));
          if (iVar2 == 0) {
            pH->aCol[local_50].iFrom = in_stack_ffffffffffffff98;
            break;
          }
        }
        if (data->nCol <= in_stack_ffffffffffffff98) {
          sqlite3ErrorMsg(in_RDI,"unknown column \"%s\" in foreign key definition",
                          *(undefined8 *)(*(long *)(in_RSI + 2) + (long)local_50 * 0x20 + 8));
          goto LAB_00167929;
        }
      }
    }
    if (in_RCX != (int *)0x0) {
      for (local_50 = 0; local_50 < local_54; local_50 = local_50 + 1) {
        in_stack_ffffffffffffff94 =
             sqlite3Strlen30(*(char **)(*(long *)(in_RCX + 2) + (long)local_50 * 0x20 + 8));
        pH->aCol[local_50].zCol = (char *)in_stack_ffffffffffffffa0;
        memcpy(in_stack_ffffffffffffffa0,
               *(void **)(*(long *)(in_RCX + 2) + (long)local_50 * 0x20 + 8),
               (long)in_stack_ffffffffffffff94);
        *(undefined1 *)
         ((long)in_stack_ffffffffffffffa0->aLimit + (long)in_stack_ffffffffffffff94 + -0x68) = 0;
        in_stack_ffffffffffffffa0 =
             (sqlite3 *)
             ((long)in_stack_ffffffffffffffa0->aLimit +
             (long)(in_stack_ffffffffffffff94 + 1) + -0x68);
      }
    }
    pH->isDeferred = '\0';
    pH->aAction[0] = (u8)in_R8D;
    pH->aAction[1] = (u8)((uint)in_R8D >> 8);
    pFVar3 = (FKey *)sqlite3HashInsert((Hash *)pH,in_stack_ffffffffffffffc0,data);
    if (pFVar3 == pH) {
      psVar1->mallocFailed = '\x01';
    }
    else {
      if (pFVar3 != (FKey *)0x0) {
        pH->pNextTo = pFVar3;
        pFVar3->pPrevTo = pH;
      }
      data->pFKey = pH;
    }
  }
LAB_00167929:
  sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                in_stack_ffffffffffffff88);
  sqlite3ExprListDelete
            (in_stack_ffffffffffffffa0,
             (ExprList *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  sqlite3ExprListDelete
            (in_stack_ffffffffffffffa0,
             (ExprList *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateForeignKey(
  Parse *pParse,       /* Parsing context */
  ExprList *pFromCol,  /* Columns in this table that point to other table */
  Token *pTo,          /* Name of the other table */
  ExprList *pToCol,    /* Columns in the other table */
  int flags            /* Conflict resolution algorithms. */
){
  sqlite3 *db = pParse->db;
#ifndef SQLITE_OMIT_FOREIGN_KEY
  FKey *pFKey = 0;
  FKey *pNextTo;
  Table *p = pParse->pNewTable;
  int nByte;
  int i;
  int nCol;
  char *z;

  assert( pTo!=0 );
  if( p==0 || IN_DECLARE_VTAB ) goto fk_end;
  if( pFromCol==0 ){
    int iCol = p->nCol-1;
    if( NEVER(iCol<0) ) goto fk_end;
    if( pToCol && pToCol->nExpr!=1 ){
      sqlite3ErrorMsg(pParse, "foreign key on %s"
         " should reference only one column of table %T",
         p->aCol[iCol].zName, pTo);
      goto fk_end;
    }
    nCol = 1;
  }else if( pToCol && pToCol->nExpr!=pFromCol->nExpr ){
    sqlite3ErrorMsg(pParse,
        "number of columns in foreign key does not match the number of "
        "columns in the referenced table");
    goto fk_end;
  }else{
    nCol = pFromCol->nExpr;
  }
  nByte = sizeof(*pFKey) + (nCol-1)*sizeof(pFKey->aCol[0]) + pTo->n + 1;
  if( pToCol ){
    for(i=0; i<pToCol->nExpr; i++){
      nByte += sqlite3Strlen30(pToCol->a[i].zName) + 1;
    }
  }
  pFKey = sqlite3DbMallocZero(db, nByte );
  if( pFKey==0 ){
    goto fk_end;
  }
  pFKey->pFrom = p;
  pFKey->pNextFrom = p->pFKey;
  z = (char*)&pFKey->aCol[nCol];
  pFKey->zTo = z;
  memcpy(z, pTo->z, pTo->n);
  z[pTo->n] = 0;
  sqlite3Dequote(z);
  z += pTo->n+1;
  pFKey->nCol = nCol;
  if( pFromCol==0 ){
    pFKey->aCol[0].iFrom = p->nCol-1;
  }else{
    for(i=0; i<nCol; i++){
      int j;
      for(j=0; j<p->nCol; j++){
        if( sqlite3StrICmp(p->aCol[j].zName, pFromCol->a[i].zName)==0 ){
          pFKey->aCol[i].iFrom = j;
          break;
        }
      }
      if( j>=p->nCol ){
        sqlite3ErrorMsg(pParse, 
          "unknown column \"%s\" in foreign key definition", 
          pFromCol->a[i].zName);
        goto fk_end;
      }
    }
  }
  if( pToCol ){
    for(i=0; i<nCol; i++){
      int n = sqlite3Strlen30(pToCol->a[i].zName);
      pFKey->aCol[i].zCol = z;
      memcpy(z, pToCol->a[i].zName, n);
      z[n] = 0;
      z += n+1;
    }
  }
  pFKey->isDeferred = 0;
  pFKey->aAction[0] = (u8)(flags & 0xff);            /* ON DELETE action */
  pFKey->aAction[1] = (u8)((flags >> 8 ) & 0xff);    /* ON UPDATE action */

  assert( sqlite3SchemaMutexHeld(db, 0, p->pSchema) );
  pNextTo = (FKey *)sqlite3HashInsert(&p->pSchema->fkeyHash, 
      pFKey->zTo, (void *)pFKey
  );
  if( pNextTo==pFKey ){
    db->mallocFailed = 1;
    goto fk_end;
  }
  if( pNextTo ){
    assert( pNextTo->pPrevTo==0 );
    pFKey->pNextTo = pNextTo;
    pNextTo->pPrevTo = pFKey;
  }

  /* Link the foreign key to the table as the last step.
  */
  p->pFKey = pFKey;
  pFKey = 0;

fk_end:
  sqlite3DbFree(db, pFKey);
#endif /* !defined(SQLITE_OMIT_FOREIGN_KEY) */
  sqlite3ExprListDelete(db, pFromCol);
  sqlite3ExprListDelete(db, pToCol);
}